

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part.c
# Opt level: O1

exr_result_t exr_set_zip_compression_level(exr_context_t ctxt,int part_index,int level)

{
  exr_result_t eVar1;
  
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
    eVar1 = (**(code **)(ctxt + 0x48))
                      (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
    return eVar1;
  }
  if (*ctxt != (_priv_exr_context_t)0x1) {
    eVar1 = (**(code **)(ctxt + 0x38))(ctxt,8);
    return eVar1;
  }
  if (level + 1U < 0xb) {
    *(int *)(*(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8) + 0xb8) = level;
    return 0;
  }
  eVar1 = (**(code **)(ctxt + 0x40))(ctxt,3,"Invalid zip level specified");
  return eVar1;
}

Assistant:

exr_result_t
exr_set_zip_compression_level (exr_context_t ctxt, int part_index, int level)
{
    exr_result_t rv;
    EXR_PROMOTE_LOCKED_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (pctxt->mode != EXR_CONTEXT_WRITE)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_NOT_OPEN_WRITE));

    if (level >= -1 && level < 10)
    {
        part->zip_compression_level = level;
        rv                          = EXR_ERR_SUCCESS;
    }
    else
    {
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->report_error (
            pctxt, EXR_ERR_INVALID_ARGUMENT, "Invalid zip level specified"));
    }

    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}